

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateAppleLibraryScript
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *evaluatedRPaths,Indent indent)

{
  char *__s;
  pointer pbVar1;
  ostream *poVar2;
  cmScriptGeneratorIndent indent_00;
  cmAlphaNum local_f8;
  undefined1 local_c8 [56];
  string local_90;
  string depNameVar;
  string depName;
  
  poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar2 = std::operator<<(poVar2,"if(NOT ");
  poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
  std::operator<<(poVar2,"_dep MATCHES \"\\\\.framework/\")\n");
  __s = this->TmpVarPrefix;
  local_f8.View_._M_len = strlen(__s);
  local_c8._0_8_ = (pointer)0x4;
  local_c8._8_8_ = "_dep";
  local_f8.View_._M_str = __s;
  cmStrCat<>(&depName,&local_f8,(cmAlphaNum *)local_c8);
  GetDestination((string *)&local_f8,this,config);
  local_c8._16_8_ = (pointer)0x0;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  indent_00.Level = indent.Level + 2;
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,(string *)&local_f8,cmInstallType_SHARED_LIBRARY,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c8,false,(this->Permissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
             " FOLLOW_SYMLINK_CHAIN",(Indent)indent_00.Level,depName._M_dataplus._M_p);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  std::__cxx11::string::~string((string *)&local_f8);
  poVar2 = ::operator<<(os,indent_00);
  poVar2 = std::operator<<(poVar2,"get_filename_component(");
  poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
  poVar2 = std::operator<<(poVar2,"_dep_name \"${");
  poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
  std::operator<<(poVar2,"_dep}\" NAME)\n");
  local_f8.View_._M_len = 2;
  local_f8.View_._M_str = "${";
  pbVar1 = (pointer)this->TmpVarPrefix;
  local_c8._0_8_ = strlen((char *)pbVar1);
  local_c8._8_8_ = pbVar1;
  cmStrCat<char[11]>(&depNameVar,&local_f8,(cmAlphaNum *)local_c8,(char (*) [11])"_dep_name}");
  local_f8.View_._M_len = 2;
  local_f8.View_._M_str = "${";
  pbVar1 = (pointer)this->TmpVarPrefix;
  local_c8._0_8_ = strlen((char *)pbVar1);
  local_c8._8_8_ = pbVar1;
  cmStrCat<char[6]>(&local_90,&local_f8,(cmAlphaNum *)local_c8,(char (*) [6])"_dep}");
  GenerateInstallNameFixup
            (this,os,config,evaluatedRPaths,&local_90,&depNameVar,(Indent)indent_00.Level);
  std::__cxx11::string::~string((string *)&local_90);
  poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  std::operator<<(poVar2,"endif()\n");
  std::__cxx11::string::~string((string *)&depNameVar);
  std::__cxx11::string::~string((string *)&depName);
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateAppleLibraryScript(
  std::ostream& os, const std::string& config,
  const std::vector<std::string>& evaluatedRPaths, Indent indent)
{
  os << indent << "if(NOT " << this->TmpVarPrefix
     << "_dep MATCHES \"\\\\.framework/\")\n";

  auto depName = cmStrCat(this->TmpVarPrefix, "_dep");
  this->AddInstallRule(
    os, this->GetDestination(config), cmInstallType_SHARED_LIBRARY, {}, false,
    this->Permissions.c_str(), nullptr, nullptr, " FOLLOW_SYMLINK_CHAIN",
    indent.Next(), depName.c_str());

  os << indent.Next() << "get_filename_component(" << this->TmpVarPrefix
     << "_dep_name \"${" << this->TmpVarPrefix << "_dep}\" NAME)\n";
  auto depNameVar = cmStrCat("${", this->TmpVarPrefix, "_dep_name}");
  this->GenerateInstallNameFixup(os, config, evaluatedRPaths,
                                 cmStrCat("${", this->TmpVarPrefix, "_dep}"),
                                 depNameVar, indent.Next());

  os << indent << "endif()\n";
}